

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::HttpClient::ConnectRequest::Status,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:7243:23)>
::getImpl(SimpleTransformPromiseNode<kj::HttpClient::ConnectRequest::Status,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:7243:23)>
          *this,ExceptionOrValue *output)

{
  AsyncIoStream *pAVar1;
  PromiseArena *pPVar2;
  PromiseArena *pPVar3;
  char *pcVar4;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 aVar5;
  undefined8 uVar6;
  HttpHeaders *pHVar7;
  void *pvVar8;
  TransformPromiseNodeBase *this_00;
  Fault f;
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  ExceptionOr<kj::HttpClient::ConnectRequest::Status> depResult;
  StringPtr local_448;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 local_438;
  undefined1 local_430 [40];
  bool local_408;
  String *local_400;
  Status local_3f8;
  ExceptionOr<kj::Promise<void>_> local_3b8;
  ExceptionOrValue local_210;
  char local_78;
  Status local_70;
  
  local_210.exception.ptr.isSet = false;
  local_78 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_210);
  pHVar7 = local_70.headers.ptr;
  uVar6 = local_210.exception.ptr.field_1.value.context.ptr.ptr;
  if (local_210.exception.ptr.isSet == true) {
    local_3b8.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         local_210.exception.ptr.field_1.value.ownFile.content.ptr;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         local_210.exception.ptr.field_1.value.ownFile.content.size_;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_210.exception.ptr.field_1.value.ownFile.content.disposer;
    local_210.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_210.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_210.exception.ptr.field_1.value.file;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_210.exception.ptr.field_1._32_8_;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         local_210.exception.ptr.field_1.value.description.content.ptr;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_210.exception.ptr.field_1.value.description.content.size_;
    local_210.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_210.exception.ptr.field_1.value.description.content.size_ = 0;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_210.exception.ptr.field_1.value.description.content.disposer;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_210.exception.ptr.field_1.value.context.ptr.disposer;
    local_210.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar6;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         local_210.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         local_210.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         local_210.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_210.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_210.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_3b8.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&local_210.exception.ptr.field_1 + 0x68),0x105);
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         local_210.exception.ptr.field_1.value.details.builder.ptr;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         local_210.exception.ptr.field_1.value.details.builder.pos;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         local_210.exception.ptr.field_1.value.details.builder.endPtr;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         local_210.exception.ptr.field_1.value.details.builder.disposer;
    local_210.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_210.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_210.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    local_3b8.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_3b8)
    ;
    aVar5 = local_3b8.value.ptr.field_1;
    if ((local_3b8.value.ptr.isSet == true) &&
       (local_3b8.value.ptr.field_1 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0)) {
      local_3b8.value.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar5);
    }
    if (local_3b8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
  }
  else if (local_78 == '\x01') {
    local_430._0_8_ = &local_3f8;
    local_3f8.statusCode = local_70.statusCode;
    local_3f8.statusText.content.ptr = local_70.statusText.content.ptr;
    local_3f8.statusText.content.size_ = local_70.statusText.content.size_;
    local_70.statusText.content.ptr = (char *)0x0;
    local_70.statusText.content.size_ = 0;
    local_3f8.statusText.content.disposer = local_70.statusText.content.disposer;
    local_3f8.headers.disposer = local_70.headers.disposer;
    local_70.headers.ptr = (HttpHeaders *)0x0;
    local_3f8.headers.ptr = pHVar7;
    local_3f8.errorBody.ptr.disposer = local_70.errorBody.ptr.disposer;
    local_3f8.errorBody.ptr.ptr = local_70.errorBody.ptr.ptr;
    local_70.errorBody.ptr.ptr = (AsyncInputStream *)0x0;
    local_430._8_4_ = 200;
    local_430._16_8_ = " == ";
    local_430._24_8_ = &DAT_00000005;
    local_430[0x20] = local_70.statusCode == 200;
    if (!local_430[0x20]) {
      Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&>
                ((Fault *)&local_448,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x1c4c,FAILED,"status.statusCode == 200","_kjCondition,",
                 (DebugComparison<unsigned_int_&,_int> *)local_430);
      Debug::Fault::fatal((Fault *)&local_448);
    }
    local_400 = &local_3f8.statusText;
    local_448.content.ptr = "OK";
    local_448.content.size_ = 3;
    DebugExpression<kj::String&>::operator==
              ((DebugComparison<kj::String_&,_kj::StringPtr> *)local_430,
               (DebugExpression<kj::String&> *)&local_400,&local_448);
    if (local_408 == false) {
      Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<kj::String&,kj::StringPtr>&>
                ((Fault *)&local_448,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x1c4d,FAILED,"status.statusText == \"OK\"_kj","_kjCondition,",
                 (DebugComparison<kj::String_&,_kj::StringPtr> *)local_430);
      Debug::Fault::fatal((Fault *)&local_448);
    }
    pAVar1 = (this->func).io.ptr;
    (**(pAVar1->super_AsyncOutputStream)._vptr_AsyncOutputStream)
              (&local_448,&pAVar1->super_AsyncOutputStream,"hello",5);
    pcVar4 = local_448.content.ptr;
    pPVar2 = (PromiseArena *)(this->func).failed;
    pPVar3 = *(PromiseArena **)((long)local_448.content.ptr + 8);
    if (pPVar3 == (PromiseArena *)0x0 || (ulong)((long)local_448.content.ptr - (long)pPVar3) < 0x30)
    {
      pvVar8 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3d0);
      TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)&local_448,
                 TransformPromiseNode<void,_kj::_::IdentityFunc<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:7247:42)>
                 ::anon_class_8_1_54ba857b_for_errorHandler::operator());
      *(undefined ***)((long)pvVar8 + 0x3d0) = &PTR_destroy_00617aa8;
      *(PromiseArena **)((long)pvVar8 + 0x3f8) = pPVar2;
      *(void **)((long)pvVar8 + 0x3d8) = pvVar8;
    }
    else {
      *(PromiseArena **)((long)local_448.content.ptr + 8) = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)((long)local_448.content.ptr + -0x30);
      TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)&local_448,
                 TransformPromiseNode<void,_kj::_::IdentityFunc<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:7247:42)>
                 ::anon_class_8_1_54ba857b_for_errorHandler::operator());
      ((PromiseArenaMember *)((long)pcVar4 + -0x30))->_vptr_PromiseArenaMember =
           (_func_int **)&PTR_destroy_00617aa8;
      ((PromiseArenaMember *)((long)pcVar4 + -0x10))->arena = pPVar2;
      ((PromiseArenaMember *)((long)pcVar4 + -0x30))->arena = pPVar3;
    }
    local_430._0_8_ = this_00;
    Promise<void>::attach<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
              (&local_438.value,(Own<kj::AsyncIoStream,_std::nullptr_t> *)local_430);
    uVar6 = local_430._0_8_;
    if ((TransformPromiseNodeBase *)local_430._0_8_ != (TransformPromiseNodeBase *)0x0) {
      local_430._0_8_ = (TransformPromiseNodeBase *)0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)uVar6);
    }
    pcVar4 = local_448.content.ptr;
    if ((PromiseArenaMember *)local_448.content.ptr != (PromiseArenaMember *)0x0) {
      local_448.content.ptr = (char *)0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)pcVar4);
    }
    HttpClient::ConnectRequest::Status::~Status(&local_3f8);
    local_3b8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_3b8.value.ptr.isSet = true;
    local_3b8.value.ptr.field_1 = local_438;
    local_438 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_3b8)
    ;
    aVar5 = local_3b8.value.ptr.field_1;
    if ((local_3b8.value.ptr.isSet == true) &&
       (local_3b8.value.ptr.field_1 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0)) {
      local_3b8.value.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar5);
    }
    if (local_3b8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    aVar5 = local_438;
    if (local_438 != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0) {
      local_438 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar5);
    }
  }
  if (local_78 == '\x01') {
    HttpClient::ConnectRequest::Status::~Status(&local_70);
  }
  if (local_210.exception.ptr.isSet == true) {
    Exception::~Exception(&local_210.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }